

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

void Wln_NtkStaticFanoutStart(Wln_Ntk_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t t;
  Vec_Int_t *vRefsCopy;
  int local_18;
  int iFanin;
  int iObj;
  int k;
  Wln_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(0);
  Wln_NtkCreateRefs(p);
  Wln_NtkStartFanoutMap(p,&p->vFanout,&p->vRefs,1);
  iVar4 = p_00->nCap;
  iVar2 = p_00->nSize;
  piVar1 = p_00->pArray;
  iVar3 = (p->vRefs).nSize;
  p_00->nCap = (p->vRefs).nCap;
  p_00->nSize = iVar3;
  p_00->pArray = (p->vRefs).pArray;
  (p->vRefs).nCap = iVar4;
  (p->vRefs).nSize = iVar2;
  (p->vRefs).pArray = piVar1;
  Wln_NtkCleanRefs(p);
  for (local_18 = 1; iVar3 = Wln_NtkObjNum(p), local_18 < iVar3; local_18 = local_18 + 1) {
    for (iFanin = 0; iVar3 = Wln_ObjFaninNum(p,local_18), iFanin < iVar3; iFanin = iFanin + 1) {
      iVar3 = Wln_ObjFanin(p,local_18,iFanin);
      if (iVar3 != 0) {
        iVar4 = Wln_ObjRefsInc(p,iVar3);
        Wln_ObjSetFanout(p,iVar3,iVar4,local_18);
      }
    }
  }
  local_18 = 1;
  while( true ) {
    iVar3 = Wln_NtkObjNum(p);
    if (iVar3 <= local_18) {
      Vec_IntFree(p_00);
      return;
    }
    iVar3 = Wln_ObjRefs(p,local_18);
    iVar4 = Vec_IntEntry(p_00,local_18);
    if (iVar3 != iVar4) break;
    local_18 = local_18 + 1;
  }
  __assert_fail("Wln_ObjRefs(p, iObj) == Vec_IntEntry(vRefsCopy, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                ,0x1a4,"void Wln_NtkStaticFanoutStart(Wln_Ntk_t *)");
}

Assistant:

void Wln_NtkStaticFanoutStart( Wln_Ntk_t * p )
{
    int k, iObj, iFanin;
    Vec_Int_t * vRefsCopy = Vec_IntAlloc(0);
    Wln_NtkCreateRefs( p );
    Wln_NtkStartFanoutMap( p, &p->vFanout, &p->vRefs, 1 );
    ABC_SWAP( Vec_Int_t, *vRefsCopy, p->vRefs );
    // add fanouts
    Wln_NtkCleanRefs( p );
    Wln_NtkForEachObj( p, iObj )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjSetFanout( p, iFanin, Wln_ObjRefsInc(p, iFanin), iObj );
    // double-check the current number of fanouts added
    Wln_NtkForEachObj( p, iObj )
        assert( Wln_ObjRefs(p, iObj) == Vec_IntEntry(vRefsCopy, iObj) );
    Vec_IntFree( vRefsCopy );
}